

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O3

void AddRef(int linenum)

{
  SymTab *pSVar1;
  Ref *pRVar2;
  long lVar3;
  SymTab *pSVar4;
  Ref *pRVar5;
  Ref *pRVar6;
  
  pSVar1 = SymCurr;
  if ((Pass2 != 0) && (XrefList != 0)) {
    pRVar2 = Sym->Ref1;
    if (Sym->Ref1 == (Ref *)0x0) {
      pRVar6 = (Ref *)0x0;
    }
    else {
      do {
        pRVar6 = pRVar2;
        lVar3 = 2;
        do {
          if (pRVar6->RefNum[lVar3 + -2] == 0) {
            pRVar6->RefNum[lVar3 + -2] = linenum;
            return;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 6);
        pRVar2 = pRVar6->NextRef;
      } while (pRVar6->NextRef != (Ref *)0x0);
    }
    pRVar2 = RefLim + 1;
    pRVar5 = RefLim;
    RefLim = pRVar2;
    if (0x2000 < (long)pRVar2 - (long)SymCurr) {
      pSVar4 = (SymTab *)malloc(0x2000);
      if (pSVar4 == (SymTab *)0x0) {
        AddRef_cold_1();
        return;
      }
      pSVar1->Link = pSVar4;
      SymCurr = pSVar4;
      pSVar4->Link = (SymTab *)0x0;
      pRVar5 = (Ref *)&pSVar4->Hunk;
      RefLim = (Ref *)(pSVar4 + 1);
    }
    pRVar5->NextRef = (Ref *)0x0;
    pRVar5->RefNum[0] = linenum;
    *(undefined8 *)(pRVar5->RefNum + 1) = 0;
    pRVar5->RefNum[3] = 0;
    if (pRVar6 == (Ref *)0x0) {
      Sym->Ref1 = pRVar5;
    }
    else {
      pRVar6->NextRef = pRVar5;
    }
  }
  return;
}

Assistant:

void AddRef(linenum)
	int linenum;
/* Adds "linenum" to the list of references
 for the symbol pointed to by Sym.  */
{
	register int i;
	register struct Ref *ref, *prevref;

	if (!Pass2)
		return; /* Pass 2 only! */
	if (!XrefList)
		return; /* No cross-reference */
	prevref = NULL;
	ref = Sym->Ref1;
	while (ref) { /* Chase pointers. */
		for (i = 0; i < MAXREF; i++) { /* Scan reference entry */
			if (ref->RefNum[i] == 0) { /*  for an empty slot.  */
				ref->RefNum[i] = linenum; /* Insert new line number. */
				return;
			}
		}
		prevref = ref; /* Remember where we were. */
		ref = ref->NextRef; /* Link to the next entry. */
	}
	ref = RefLim; /* Pointer to new entry */
	RefLim++; /* Bump limit pointer. */
	if (((char *) RefLim - (char *) SymCurr) > CHUNKSIZE) {
		ref = (struct Ref *) malloc((unsigned) CHUNKSIZE);
		if (ref == NULL) {
			fprintf(stderr, "     \nOut of memory - cross-reference disabled.\n");
			XrefList = FALSE;
			return;
		}
		SymCurr->Link = (struct SymTab *) ref; /* Link from prev. chunk */
		SymCurr = (struct SymTab *) ref; /* Make the new chunk current. */
		SymCurr->Link = NULL; /* Clear forward pointer. */
		ref++; /* Skip over pointer entry. */
		RefLim = ref; /* New table limit */
		RefLim++; /* Bump it. */
	}
	ref->NextRef = NULL; /* Pointer to next entry */
	ref->RefNum[0] = linenum; /* First reference in new entry */
	for (i = 1; i < MAXREF; i++)
		ref->RefNum[i] = 0; /* Clear remaining slots. */
	if (prevref == NULL)
		Sym->Ref1 = ref; /* Link to first entry */
	else
		prevref->NextRef = ref; /* Link to next entry */
}